

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::DatagramPortImpl::ReceiverImpl::receive(ReceiverImpl *this)

{
  int type;
  undefined8 *puVar1;
  size_t sVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  uchar *puVar6;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> WVar7;
  long in_RSI;
  ArrayPtr<const_unsigned_char> data;
  byte *local_1a8;
  AncillaryMessage local_170;
  uchar *local_158;
  byte *end;
  byte *begin;
  size_t available;
  byte *pos;
  cmsghdr *cmsg;
  undefined1 local_128 [32];
  Fault f;
  SyscallResult local_ec;
  undefined1 auStack_e8 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  iovec iov;
  sockaddr_storage addr;
  msghdr msg;
  ReceiverImpl *this_local;
  
  memset(&addr.__ss_align,0,0x38);
  memset(&iov.iov_len,0,0x80);
  addr.__ss_align = (unsigned_long)&iov.iov_len;
  msg.msg_name._0_4_ = 0x80;
  n = (ssize_t)Array<unsigned_char>::begin((Array<unsigned_char> *)(in_RSI + 0x10));
  iov.iov_base = (void *)Array<unsigned_char>::size((Array<unsigned_char> *)(in_RSI + 0x10));
  msg._8_8_ = &n;
  msg.msg_iov = (iovec *)0x1;
  msg.msg_iovlen = (size_t)Array<unsigned_char>::begin((Array<unsigned_char> *)(in_RSI + 0x28));
  msg.msg_control = (void *)Array<unsigned_char>::size((Array<unsigned_char> *)(in_RSI + 0x28));
  f.exception = (Exception *)auStack_e8;
  local_ec = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl::receive()::_lambda()_1_>
                       ((anon_class_24_3_c5cf561a *)&f,true);
  pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_ec);
  if (pvVar4 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_ec);
    kj::_::Debug::Fault::Fault
              ((Fault *)(local_128 + 0x18),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x748,iVar3,"n = recvmsg(port.fd, &msg, 0)","");
    kj::_::Debug::Fault::fatal((Fault *)(local_128 + 0x18));
  }
  if ((long)_auStack_e8 < 0) {
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_128);
    Promise<void>::
    then<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl::receive()::_lambda()_2_>
              ((Promise<void> *)this,(Type *)local_128);
    Promise<void>::~Promise((Promise<void> *)local_128);
  }
  else {
    puVar1 = *(undefined8 **)(*(long *)(in_RSI + 8) + 0x20);
    uVar5 = (**(code **)*puVar1)(puVar1,addr.__ss_align,msg.msg_name._0_4_);
    if ((uVar5 & 1) == 0) {
      receive(this);
    }
    else {
      *(Disposer **)(in_RSI + 0x60) = _auStack_e8;
      *(bool *)(in_RSI + 0x68) = ((uint)msg.msg_controllen & 0x20) != 0;
      Maybe<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl::StoredAddress>::
      emplace<kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,void*&,unsigned_int&>
                ((Maybe<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl::StoredAddress> *)
                 (in_RSI + 0x70),*(LowLevelAsyncIoProvider **)(*(long *)(in_RSI + 8) + 0x10),
                 *(NetworkFilter **)(*(long *)(in_RSI + 8) + 0x20),(void **)&addr.__ss_align,
                 (uint *)&msg);
      Vector<kj::AncillaryMessage>::resize((Vector<kj::AncillaryMessage> *)(in_RSI + 0x40),0);
      *(bool *)(in_RSI + 0x69) = ((uint)msg.msg_controllen & 8) != 0;
      if (msg.msg_control < (void *)0x10) {
        local_1a8 = (byte *)0x0;
      }
      else {
        local_1a8 = (byte *)msg.msg_iovlen;
      }
      for (pos = local_1a8; pos != (byte *)0x0;
          pos = (byte *)__cmsg_nxthdr((msghdr *)&addr.__ss_align,(cmsghdr *)pos)) {
        available = (size_t)pos;
        puVar6 = Array<unsigned_char>::end((Array<unsigned_char> *)(in_RSI + 0x28));
        sVar2 = available;
        begin = puVar6 + -available;
        if (begin < (uchar *)0x10) break;
        end = pos + 0x10;
        WVar7 = min<unsigned_long&,unsigned_long&>((unsigned_long *)&begin,(unsigned_long *)pos);
        local_158 = (uchar *)(sVar2 + WVar7);
        iVar3 = *(int *)(pos + 8);
        type = *(int *)(pos + 0xc);
        data = arrayPtr<unsigned_char_const>(end,local_158);
        AncillaryMessage::AncillaryMessage(&local_170,iVar3,type,data);
        Vector<kj::AncillaryMessage>::add<kj::AncillaryMessage>
                  ((Vector<kj::AncillaryMessage> *)(in_RSI + 0x40),&local_170);
      }
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> receive() override {
    struct msghdr msg;
    memset(&msg, 0, sizeof(msg));

    struct sockaddr_storage addr;
    memset(&addr, 0, sizeof(addr));
    msg.msg_name = &addr;
    msg.msg_namelen = sizeof(addr);

    struct iovec iov;
    iov.iov_base = contentBuffer.begin();
    iov.iov_len = contentBuffer.size();
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;
    msg.msg_control = ancillaryBuffer.begin();
    msg.msg_controllen = ancillaryBuffer.size();

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = recvmsg(port.fd, &msg, 0));

    if (n < 0) {
      // No data available. Wait.
      return port.observer.whenBecomesReadable().then([this]() {
        return receive();
      });
    } else {
      if (!port.filter.shouldAllow(reinterpret_cast<const struct sockaddr*>(msg.msg_name),
                                   msg.msg_namelen)) {
        // Ignore message from disallowed source.
        return receive();
      }

      receivedSize = n;
      contentTruncated = msg.msg_flags & MSG_TRUNC;

      source.emplace(port.lowLevel, port.filter, msg.msg_name, msg.msg_namelen);

      ancillaryList.resize(0);
      ancillaryTruncated = msg.msg_flags & MSG_CTRUNC;

      for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg); cmsg != nullptr;
           cmsg = CMSG_NXTHDR(&msg, cmsg)) {
        // On some platforms (OSX), a cmsghdr's length may cross the end of the ancillary buffer
        // when truncated. On other platforms (Linux) the length in cmsghdr will itself be
        // truncated to fit within the buffer.

#if __APPLE__
// On MacOS, `CMSG_SPACE(0)` triggers a bogus warning.
#pragma GCC diagnostic ignored "-Wnull-pointer-arithmetic"
#endif
        const byte* pos = reinterpret_cast<const byte*>(cmsg);
        size_t available = ancillaryBuffer.end() - pos;
        if (available < CMSG_SPACE(0)) {
          // The buffer ends in the middle of the header. We can't use this message.
          // (On Linux, this never happens, because the message is not included if there isn't
          // space for a header. I'm not sure how other systems behave, though, so let's be safe.)
          break;
        }

        // OK, we know the cmsghdr is valid, at least.

        // Find the start of the message payload.
        const byte* begin = (const byte *)CMSG_DATA(cmsg);

        // Cap the message length to the available space.
        const byte* end = pos + kj::min(available, cmsg->cmsg_len);

        ancillaryList.add(AncillaryMessage(
            cmsg->cmsg_level, cmsg->cmsg_type, arrayPtr(begin, end)));
      }

      return READY_NOW;
    }
  }